

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

_Bool extent_purge_lazy_impl
                (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,size_t offset,size_t length,
                _Bool growing_retained)

{
  int8_t *piVar1;
  ulong uVar2;
  extent_hooks_t *peVar3;
  _Bool _Var4;
  undefined1 uVar5;
  tsd_t *tsd;
  void *addr;
  long *in_FS_OFFSET;
  
  addr = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  uVar2 = (edata->field_2).e_size_esn;
  peVar3 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar3 != &duckdb_je_ehooks_default_extent_hooks) {
    if (peVar3->purge_lazy == (undefined1 *)0x0) {
      uVar5 = 1;
    }
    else {
      tsd = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
        tsd = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      if ((tsd->state).repr == '\0') {
        duckdb_je_tsd_slow_update(tsd);
      }
      uVar5 = (*(code *)peVar3->purge_lazy)
                        (peVar3,addr,uVar2 & 0xfffffffffffff000,offset,length,ehooks->ind);
      if ((tsdn == (tsdn_t *)0x0) &&
         (tsdn = (tsdn_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
        tsdn = (tsdn_t *)duckdb_je_tsd_fetch_slow((tsd_t *)tsdn,false);
      }
      piVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        duckdb_je_tsd_slow_update(&tsdn->tsd);
      }
    }
    return (_Bool)uVar5;
  }
  _Var4 = duckdb_je_ehooks_default_purge_lazy_impl(addr,offset,length);
  return _Var4;
}

Assistant:

static bool
extent_purge_lazy_impl(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    size_t offset, size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);
	bool err = ehooks_purge_lazy(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), offset, length);
	return err;
}